

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OclCnRunner.cpp
# Opt level: O1

void __thiscall xmrig::OclCnRunner::~OclCnRunner(OclCnRunner *this)

{
  CnBranchKernel *pCVar1;
  pointer ppCVar2;
  pointer pp_Var3;
  size_t i;
  long lVar4;
  
  (this->super_OclBaseRunner).super_IOclRunner._vptr_IOclRunner =
       (_func_int **)&PTR__OclCnRunner_001b01d0;
  if (this->m_cn1 != (Cn1Kernel *)0x0) {
    (*(this->m_cn1->super_OclKernel)._vptr_OclKernel[1])();
  }
  if (this->m_cn2 != (Cn2Kernel *)0x0) {
    (*(this->m_cn2->super_OclKernel)._vptr_OclKernel[1])();
  }
  OclLib::release(this->m_scratchpads);
  OclLib::release(this->m_states);
  lVar4 = 0;
  do {
    pCVar1 = (this->m_branchKernels).
             super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
             _M_impl.super__Vector_impl_data._M_start[lVar4];
    if (pCVar1 != (CnBranchKernel *)0x0) {
      (*(pCVar1->super_OclKernel)._vptr_OclKernel[1])();
    }
    OclLib::release((this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>.
                    _M_impl.super__Vector_impl_data._M_start[lVar4]);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  ppCVar2 = (this->m_branchKernels).
            super__Vector_base<xmrig::CnBranchKernel_*,_std::allocator<xmrig::CnBranchKernel_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppCVar2 != (pointer)0x0) {
    operator_delete(ppCVar2);
  }
  pp_Var3 = (this->m_branches).super__Vector_base<_cl_mem_*,_std::allocator<_cl_mem_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (pp_Var3 != (pointer)0x0) {
    operator_delete(pp_Var3);
  }
  OclBaseRunner::~OclBaseRunner(&this->super_OclBaseRunner);
  return;
}

Assistant:

xmrig::OclCnRunner::~OclCnRunner()
{
    delete m_cn1;
    delete m_cn2;

    OclLib::release(m_scratchpads);
    OclLib::release(m_states);

    for (size_t i = 0; i < BRANCH_MAX; ++i) {
        delete m_branchKernels[i];
        OclLib::release(m_branches[i]);
    }
}